

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O2

optional<QDBusInterface> *
getPrimaryDevice(optional<QDBusInterface> *__return_storage_ptr__,QDBusObjectPath *devicePath)

{
  char cVar1;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QDBusConnection aQStack_c8 [8];
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  char *local_a8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<QDBusObjectPath> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0xaaaaaaaaaaaaaaaa;
  uStack_60 = 0xaaaaaaaaaaaaaaaa;
  latin1.m_data = "org.freedesktop.NetworkManager";
  latin1.m_size = 0x1e;
  QString::QString((QString *)&local_58,latin1);
  local_88.d = (Data *)(devicePath->m_path).d.d;
  local_88.ptr = (QDBusObjectPath *)(devicePath->m_path).d.ptr;
  local_88.size = (devicePath->m_path).d.size;
  if (local_88.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  latin1_00.m_data = "org.freedesktop.NetworkManager.Connection.Active";
  latin1_00.m_size = 0x30;
  QString::QString((QString *)&local_a0,latin1_00);
  QDBusConnection::systemBus();
  QDBusInterface::QDBusInterface
            ((QDBusInterface *)&local_68,(QString *)local_58.data,(QString *)&local_88,
             (QString *)&local_a0,(QDBusConnection *)&local_b0,(QObject *)0x0);
  QDBusConnection::~QDBusConnection((QDBusConnection *)&local_b0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  cVar1 = QDBusAbstractInterface::isValid();
  if (cVar1 == '\0') {
    (__return_storage_ptr__->super__Optional_base<QDBusInterface,_false,_false>)._M_payload.
    super__Optional_payload<QDBusInterface,_true,_false,_false>.
    super__Optional_payload_base<QDBusInterface>._M_engaged = false;
  }
  else {
    local_88.size = -0x5555555555555556;
    local_88.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.ptr = (QDBusObjectPath *)0xaaaaaaaaaaaaaaaa;
    QObject::property((char *)local_58.data);
    qvariant_cast<QList<QDBusObjectPath>>((QList<QDBusObjectPath> *)&local_88,(QVariant *)&local_58)
    ;
    QVariant::~QVariant((QVariant *)&local_58);
    if (local_88.size == 0) {
      (__return_storage_ptr__->super__Optional_base<QDBusInterface,_false,_false>)._M_payload.
      super__Optional_payload<QDBusInterface,_true,_false,_false>.
      super__Optional_payload_base<QDBusInterface>._M_engaged = false;
    }
    else {
      local_58.shared = (PrivateShared *)((local_88.ptr)->m_path).d.d;
      local_a0.ptr = ((local_88.ptr)->m_path).d.ptr;
      local_a0.size = ((local_88.ptr)->m_path).d.size;
      if (local_58.shared == (PrivateShared *)0x0) {
        local_a0.d = (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)local_58.shared = *(int *)local_58.shared + 1;
        UNLOCK();
        local_a0.d = (Data *)local_58.shared;
      }
      local_b0 = 0x1e;
      local_a8 = "org.freedesktop.NetworkManager";
      if ((PrivateShared *)local_a0.d != (PrivateShared *)0x0) {
        LOCK();
        *(int *)local_a0.d = *(int *)local_a0.d + 1;
        UNLOCK();
      }
      local_c0 = 0x25;
      local_b8 = "org.freedesktop.NetworkManager.Device";
      local_58._8_8_ = local_a0.ptr;
      local_58._16_8_ = local_a0.size;
      QDBusConnection::systemBus();
      std::_Optional_payload_base<QDBusInterface>::
      _Optional_payload_base<QLatin1String,QString,QLatin1String,QDBusConnection>
                ((_Optional_payload_base<QDBusInterface> *)__return_storage_ptr__,&local_b0,
                 &local_a0,&local_c0,aQStack_c8);
      QDBusConnection::~QDBusConnection(aQStack_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    QArrayDataPointer<QDBusObjectPath>::~QArrayDataPointer(&local_88);
  }
  QDBusInterface::~QDBusInterface((QDBusInterface *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QDBusInterface> getPrimaryDevice(const QDBusObjectPath &devicePath)
{
    const QDBusInterface connection(NM_DBUS_SERVICE, devicePath.path(),
                                    NM_CONNECTION_DBUS_INTERFACE, QDBusConnection::systemBus());
    if (!connection.isValid())
        return std::nullopt;

    const auto devicePaths = connection.property("Devices").value<QList<QDBusObjectPath>>();
    if (devicePaths.isEmpty())
        return std::nullopt;

    const QDBusObjectPath primaryDevicePath = devicePaths.front();
    return std::make_optional<QDBusInterface>(NM_DBUS_SERVICE, primaryDevicePath.path(),
                                              NM_DEVICE_DBUS_INTERFACE,
                                              QDBusConnection::systemBus());
}